

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O3

void __thiscall Vector4f::Vector4f(Vector4f *this,float x,float y,Vector2f *zw)

{
  float fVar1;
  
  this->m_elements[0] = x;
  this->m_elements[1] = y;
  fVar1 = Vector2f::x(zw);
  this->m_elements[2] = fVar1;
  fVar1 = Vector2f::y(zw);
  this->m_elements[3] = fVar1;
  return;
}

Assistant:

Vector4f::Vector4f( float x, float y, const Vector2f& zw )
{
	m_elements[0] = x;
	m_elements[1] = y;
	m_elements[2] = zw.x();
	m_elements[3] = zw.y();
}